

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O3

void SoPlex_addColReal(void *soplex,double *colentries,int colsize,int nnonzeros,double objval,
                      double lb,double ub)

{
  uint n;
  ulong uVar1;
  DSVectorBase<double> local_88;
  LPColBase<double> local_68;
  
  local_88.super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  local_88.super_SVectorBase<double>.memsize = 0;
  local_88.super_SVectorBase<double>.memused = 0;
  local_88._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  local_88.theelem = (Nonzero<double> *)0x0;
  n = 2;
  if (0 < nnonzeros) {
    n = nnonzeros;
  }
  ::soplex::spx_alloc<soplex::Nonzero<double>*>(&local_88.theelem,n);
  local_88.super_SVectorBase<double>.m_elem = local_88.theelem;
  local_88.super_SVectorBase<double>.memused = 0;
  local_88.super_SVectorBase<double>.memsize = n;
  if (0 < colsize) {
    uVar1 = 0;
    do {
      if ((*colentries != 0.0) || (NAN(*colentries))) {
        ::soplex::DSVectorBase<double>::add(&local_88,(int)uVar1,colentries);
      }
      uVar1 = uVar1 + 1;
      colentries = colentries + 1;
    } while ((uint)colsize != uVar1);
  }
  local_68.up = ub;
  local_68.low = lb;
  local_68.object = objval;
  ::soplex::DSVectorBase<double>::DSVectorBase<double>
            (&local_68.vec,&local_88.super_SVectorBase<double>);
  ::soplex::SoPlexBase<double>::addColReal((SoPlexBase<double> *)soplex,&local_68);
  local_68.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  if (local_68.vec.theelem != (Nonzero<double> *)0x0) {
    free(local_68.vec.theelem);
  }
  local_88._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_003ae9c8;
  if (local_88.theelem != (Nonzero<double> *)0x0) {
    free(local_88.theelem);
  }
  return;
}

Assistant:

void SoPlex_addColReal(void* soplex, double* colentries, int colsize, int nnonzeros, double objval,
                       double lb, double ub)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector col(nnonzeros);

   /* add nonzero entries to column vector */
   for(int i = 0; i < colsize; ++i)
   {
      if(colentries[i] != 0.0)
         col.add(i, colentries[i]);
   }

   so->addColReal(LPCol(objval, col, ub, lb));
}